

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void get_tile_buffer(uint8_t *data_end,int tile_size_bytes,int is_last,
                    aom_internal_error_info *error_info,uint8_t **data,TileBufferDec *buf)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  aom_internal_error_info *in_RCX;
  int in_EDX;
  int in_ESI;
  uint8_t *in_RDI;
  long *in_R8;
  long *in_R9;
  size_t size;
  undefined8 in_stack_ffffffffffffffd0;
  int sz;
  
  sz = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  if (in_EDX == 0) {
    iVar1 = read_is_valid((uint8_t *)*in_R8,(long)in_ESI,in_RDI);
    if (iVar1 == 0) {
      aom_internal_error(in_RCX,AOM_CODEC_CORRUPT_FRAME,"Not enough data to read tile size");
    }
    sVar2 = mem_get_varsize((uint8_t *)in_R9,sz);
    uVar3 = sVar2 + 1;
    *in_R8 = *in_R8 + (long)in_ESI;
    if ((ulong)((long)in_RDI - *in_R8) < uVar3) {
      aom_internal_error(in_RCX,AOM_CODEC_CORRUPT_FRAME,"Truncated packet or corrupt tile size");
    }
  }
  else {
    uVar3 = (long)in_RDI - *in_R8;
  }
  *in_R9 = *in_R8;
  in_R9[1] = uVar3;
  *in_R8 = uVar3 + *in_R8;
  return;
}

Assistant:

static inline void get_tile_buffer(const uint8_t *const data_end,
                                   const int tile_size_bytes, int is_last,
                                   struct aom_internal_error_info *error_info,
                                   const uint8_t **data,
                                   TileBufferDec *const buf) {
  size_t size;

  if (!is_last) {
    if (!read_is_valid(*data, tile_size_bytes, data_end))
      aom_internal_error(error_info, AOM_CODEC_CORRUPT_FRAME,
                         "Not enough data to read tile size");

    size = mem_get_varsize(*data, tile_size_bytes) + AV1_MIN_TILE_SIZE_BYTES;
    *data += tile_size_bytes;

    if (size > (size_t)(data_end - *data))
      aom_internal_error(error_info, AOM_CODEC_CORRUPT_FRAME,
                         "Truncated packet or corrupt tile size");
  } else {
    size = data_end - *data;
  }

  buf->data = *data;
  buf->size = size;

  *data += size;
}